

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_loaded_list_tests.cpp
# Opt level: O2

void __thiscall
omp_make_loaded_list_empty_test_Test::TestBody(omp_make_loaded_list_empty_test_Test *this)

{
  FunctionMocker<void_()> *this_00;
  element_type *mock_obj;
  TypedExpectation<bool_(long_*)> *this_01;
  char *pcVar1;
  WithoutMatchers *extraout_RDX;
  long *plVar2;
  char *in_R9;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  AssertHelper local_90;
  AssertionResult gtest_ar__1;
  undefined1 local_78 [32];
  AssertionResult gtest_ar_;
  loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::TestMock,_long,_(anonymous_namespace)::TestValue>_>
  list;
  shared_ptr<(anonymous_namespace)::TestMock> mock;
  
  std::make_shared<(anonymous_namespace)::TestMock>();
  mock_obj = mock.super___shared_ptr<(anonymous_namespace)::TestMock,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  testing::internal::GetWithoutMatchers();
  this_00 = &mock_obj->gmock00_LoadDataList_30;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,mock_obj);
  pcVar1 = "*mock.get()";
  local_78._0_8_ = this_00;
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            ((MockSpec<void_()> *)local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/make_loaded_list_tests.cpp"
             ,0x30,"*mock.get()","LoadDataList");
  testing::internal::GetWithoutMatchers();
  anon_unknown.dwarf_3c82f::TestMock::gmock_Count
            ((MockSpec<bool_(long_*)> *)local_78,
             mock.super___shared_ptr<(anonymous_namespace)::TestMock,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,extraout_RDX,(Function<bool_(long_*)> *)pcVar1);
  pcVar1 = "*mock.get()";
  this_01 = testing::internal::MockSpec<bool_(long_*)>::InternalExpectedAt
                      ((MockSpec<bool_(long_*)> *)local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/make_loaded_list_tests.cpp"
                       ,0x32,"*mock.get()","Count");
  local_90.data_._0_4_ = 0;
  testing::internal::ReturnAction<bool>::ReturnAction((ReturnAction<bool> *)&gtest_ar__1,true);
  testing::
  DoAll<testing::internal::SetArgumentPointeeAction<0ul,int,void>,testing::internal::ReturnAction<bool>>
            ((DoAllAction<testing::internal::SetArgumentPointeeAction<0UL,_int,_void>,_testing::internal::ReturnAction<bool>_>
              *)&gtest_ar_,(testing *)&local_90,
             (SetArgumentPointeeAction<0UL,_int,_void> *)&gtest_ar__1,(ReturnAction<bool> *)pcVar1);
  testing::internal::DoAllAction::operator_cast_to_Action
            ((Action<bool_(long_*)> *)&list,(DoAllAction *)&gtest_ar_);
  testing::internal::TypedExpectation<bool_(long_*)>::WillRepeatedly
            (this_01,(Action<bool_(long_*)> *)&list);
  std::_Function_base::~_Function_base((_Function_base *)&list);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar__1.message_);
  testing::internal::MatcherBase<long_*>::~MatcherBase((MatcherBase<long_*> *)(local_78 + 8));
  omp::make_loaded_list<(anonymous_namespace)::TestMock>(&list,&mock);
  this_02 = &gtest_ar_.message_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = list.count == 0;
  if (gtest_ar_.success_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_02);
    omp::
    loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::TestMock,_long,_(anonymous_namespace)::TestValue>_>
    ::begin((const_iterator *)local_78,&list);
    omp::
    loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::TestMock,_long,_(anonymous_namespace)::TestValue>_>
    ::end((const_iterator *)&gtest_ar_,&list);
    this_02 = &gtest_ar__1.message_;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )local_78._8_8_ ==
         (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )gtest_ar_.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    if (gtest_ar__1.success_) goto LAB_0011b71f;
    testing::Message::Message((Message *)&gtest_ar_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)&gtest_ar__1,
               (AssertionResult *)"std::cbegin(list) == std::cend(list)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/make_loaded_list_tests.cpp"
               ,0x38,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)local_78);
    plVar2 = (long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)&gtest_ar_,(AssertionResult *)"std::empty(list)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/make_loaded_list_tests.cpp"
               ,0x37,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)local_78);
    plVar2 = (long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_);
  }
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
LAB_0011b71f:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_02);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&list.
              super_shared_ptr_wrapper<(anonymous_namespace)::TestMock,_long,_(anonymous_namespace)::TestValue>
              .list.super___shared_ptr<(anonymous_namespace)::TestMock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mock.super___shared_ptr<(anonymous_namespace)::TestMock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(omp_make_loaded_list, empty_test) {
  auto mock = std::make_shared<TestMock>();

  EXPECT_CALL(*mock.get(), LoadDataList);

  EXPECT_CALL(*mock.get(), Count)
      .WillRepeatedly(DoAll(SetArgPointee<0>(0), Return(true)));

  auto list = omp::make_loaded_list(mock);

  ASSERT_TRUE(std::empty(list));
  ASSERT_TRUE(std::cbegin(list) == std::cend(list));
}